

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::RealMath2Function<&atan2>::RealMath2Function
          (RealMath2Function<&atan2> *this,Compilation *comp,string *name)

{
  initializer_list<const_slang::ast::Type_*> __l;
  Type *returnType;
  allocator<const_slang::ast::Type_*> local_59;
  Type *local_58;
  Type *local_50;
  iterator local_48;
  size_type local_40;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_38;
  string *local_20;
  string *name_local;
  Compilation *comp_local;
  RealMath2Function<&atan2> *this_local;
  
  local_20 = name;
  name_local = (string *)comp;
  comp_local = (Compilation *)this;
  local_58 = Compilation::getRealType(comp);
  local_50 = Compilation::getRealType((Compilation *)name_local);
  local_48 = &local_58;
  local_40 = 2;
  std::allocator<const_slang::ast::Type_*>::allocator(&local_59);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_38,__l,&local_59);
  returnType = Compilation::getRealType((Compilation *)name_local);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,name,Function,2,&local_38,returnType,false,false);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (&local_38);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_59);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__RealMath2Function_009163b0;
  return;
}

Assistant:

RealMath2Function(Compilation& comp, const std::string& name) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, 2,
                               {&comp.getRealType(), &comp.getRealType()}, comp.getRealType(),
                               false) {}